

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O1

axbStatus_t axbVecSqrtAbs(axbVec_s *x)

{
  axbOpDescriptor_t *paVar1;
  axbStatus_t aVar2;
  
  if (x->init == 0x1d232) {
    paVar1 = x->opBackend->op_table;
    (*paVar1[1].func)(x,paVar1[1].func_data);
    aVar2 = 0;
  }
  else {
    axbVecSqrtAbs_cold_1();
    aVar2 = 0x1d232;
  }
  return aVar2;
}

Assistant:

axbStatus_t axbVecSqrtAbs(struct axbVec_s *x)
{
  AXB_VECTOR_INIT_CHECK(x);

  axbOpDescriptor_t op_desc = x->opBackend->op_table[AXB_OP_VEC_SQRTABS];
  axbStatus_t (*op)(struct axbVec_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, void*)) op_desc.func;
  op(x, op_desc.func_data);
  return 0;
}